

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seg_common.c
# Opt level: O0

void av1_calculate_segdata(segmentation *seg)

{
  int j;
  int i;
  segmentation *seg_local;
  
  seg->segid_preskip = '\0';
  seg->last_active_segid = 0;
  for (i = 0; i < 8; i = i + 1) {
    for (j = 0; j < 8; j = j + 1) {
      if ((seg->feature_mask[i] & 1 << ((byte)j & 0x1f)) != 0) {
        seg->segid_preskip = seg->segid_preskip | 4 < j;
        seg->last_active_segid = i;
      }
    }
  }
  return;
}

Assistant:

void av1_calculate_segdata(struct segmentation *seg) {
  seg->segid_preskip = 0;
  seg->last_active_segid = 0;
  for (int i = 0; i < MAX_SEGMENTS; i++) {
    for (int j = 0; j < SEG_LVL_MAX; j++) {
      if (seg->feature_mask[i] & (1 << j)) {
        seg->segid_preskip |= (j >= SEG_LVL_REF_FRAME);
        seg->last_active_segid = i;
      }
    }
  }
}